

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSMC.h
# Opt level: O3

void __thiscall
chrono::ChContactSMC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>::
CreateJacobians(ChContactSMC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_> *this)

{
  double *pdVar1;
  int iVar2;
  int iVar3;
  ChContactJacobian *pCVar4;
  undefined4 extraout_var;
  long lVar5;
  undefined4 extraout_var_00;
  long *plVar6;
  ChContactable_1vars<3> *pCVar7;
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> vars;
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> local_78;
  ChMatrixRef local_60;
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> local_38;
  
  pCVar4 = this->m_Jac;
  if (pCVar4 != (ChContactJacobian *)0x0) {
    pdVar1 = (pCVar4->m_R).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
             m_storage.m_data;
    if (pdVar1 != (double *)0x0) {
      free((void *)pdVar1[-1]);
    }
    pdVar1 = (pCVar4->m_K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
             m_storage.m_data;
    if (pdVar1 != (double *)0x0) {
      free((void *)pdVar1[-1]);
    }
    ChKblockGeneric::~ChKblockGeneric(&pCVar4->m_KRM);
  }
  operator_delete(pCVar4,0x68);
  pCVar4 = (ChContactJacobian *)::operator_new(0x68);
  (pCVar4->m_KRM).super_ChKblock._vptr_ChKblock = (_func_int **)&PTR__ChKblockGeneric_00b3a868;
  (pCVar4->m_KRM).K.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (pCVar4->m_KRM).K.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
  m_rows = 0;
  (pCVar4->m_KRM).K.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
  m_cols = 0;
  (pCVar4->m_KRM).variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pCVar4->m_KRM).variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pCVar4->m_KRM).variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pCVar4->m_K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (pCVar4->m_K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows =
       0;
  (pCVar4->m_KRM).variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pCVar4->m_KRM).variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pCVar4->m_K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (pCVar4->m_K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows =
       0;
  (pCVar4->m_K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols =
       0;
  (pCVar4->m_R).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (pCVar4->m_R).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows =
       0;
  (pCVar4->m_R).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols =
       0;
  local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl
  .super__Vector_impl_data._0_16_ = ZEXT416(0) << 0x40;
  this->m_Jac = pCVar4;
  local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (ChVariables **)0x0;
  pCVar7 = (this->
           super_ChContactTuple<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>).
           objA;
  iVar2 = (*(pCVar7->super_ChVariableTupleCarrier_1vars<3>)._vptr_ChVariableTupleCarrier_1vars[2])
                    (&pCVar7->super_ChVariableTupleCarrier_1vars<3>);
  local_60.
  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>.
  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
  .
  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
  .m_data = (PointerType)CONCAT44(extraout_var,iVar2);
  if (local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
    _M_realloc_insert<chrono::ChVariables*>
              ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_78,
               (iterator)
               local_78.
               super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
               _M_impl.super__Vector_impl_data._M_finish,(ChVariables **)&local_60);
  }
  else {
    *local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
     _M_impl.super__Vector_impl_data._M_finish =
         (ChVariables *)
         local_60.
         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
         .
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
         .
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
         .m_data;
    local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  pCVar7 = (this->
           super_ChContactTuple<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>).
           objA;
  lVar5 = __dynamic_cast(pCVar7,&ChContactable_1vars<3>::typeinfo,
                         &ChContactable_3vars<3,3,3>::typeinfo,0xfffffffffffffffe);
  if (lVar5 != 0) {
    plVar6 = (long *)(lVar5 + 0x18);
    local_60.
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_data = (PointerType)(**(code **)(*(long *)(lVar5 + 0x18) + 0x18))(plVar6);
    if (local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
      _M_realloc_insert<chrono::ChVariables*>
                ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_78,
                 (iterator)
                 local_78.
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(ChVariables **)&local_60);
    }
    else {
      *local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
       _M_impl.super__Vector_impl_data._M_finish =
           (ChVariables *)
           local_60.
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_data;
      local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_78.
           super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl
           .super__Vector_impl_data._M_finish + 1;
    }
    local_60.
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_data = (PointerType)(**(code **)(*plVar6 + 0x20))(plVar6);
    if (local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
      _M_realloc_insert<chrono::ChVariables*>
                ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_78,
                 (iterator)
                 local_78.
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(ChVariables **)&local_60);
    }
    else {
      *local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
       _M_impl.super__Vector_impl_data._M_finish =
           (ChVariables *)
           local_60.
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_data;
      local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_78.
           super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl
           .super__Vector_impl_data._M_finish + 1;
    }
    pCVar7 = (this->
             super_ChContactTuple<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>).
             objA;
  }
  iVar2 = (*(pCVar7->super_ChContactable)._vptr_ChContactable[4])(pCVar7);
  pCVar7 = (this->
           super_ChContactTuple<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>).
           objB;
  iVar3 = (*(pCVar7->super_ChVariableTupleCarrier_1vars<3>)._vptr_ChVariableTupleCarrier_1vars[2])
                    (&pCVar7->super_ChVariableTupleCarrier_1vars<3>);
  local_60.
  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>.
  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
  .
  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
  .m_data = (PointerType)CONCAT44(extraout_var_00,iVar3);
  if (local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
    _M_realloc_insert<chrono::ChVariables*>
              ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_78,
               (iterator)
               local_78.
               super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
               _M_impl.super__Vector_impl_data._M_finish,(ChVariables **)&local_60);
  }
  else {
    *local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
     _M_impl.super__Vector_impl_data._M_finish =
         (ChVariables *)
         local_60.
         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
         .
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
         .
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
         .m_data;
    local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  pCVar7 = (this->
           super_ChContactTuple<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>).
           objB;
  lVar5 = __dynamic_cast(pCVar7,&ChContactable_1vars<3>::typeinfo,
                         &ChContactable_3vars<3,3,3>::typeinfo,0xfffffffffffffffe);
  if (lVar5 != 0) {
    plVar6 = (long *)(lVar5 + 0x18);
    local_60.
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_data = (PointerType)(**(code **)(*(long *)(lVar5 + 0x18) + 0x18))(plVar6);
    if (local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
      _M_realloc_insert<chrono::ChVariables*>
                ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_78,
                 (iterator)
                 local_78.
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(ChVariables **)&local_60);
    }
    else {
      *local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
       _M_impl.super__Vector_impl_data._M_finish =
           (ChVariables *)
           local_60.
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_data;
      local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_78.
           super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl
           .super__Vector_impl_data._M_finish + 1;
    }
    local_60.
    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
    .
    super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_data = (PointerType)(**(code **)(*plVar6 + 0x20))(plVar6);
    if (local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
      _M_realloc_insert<chrono::ChVariables*>
                ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_78,
                 (iterator)
                 local_78.
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(ChVariables **)&local_60);
    }
    else {
      *local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
       _M_impl.super__Vector_impl_data._M_finish =
           (ChVariables *)
           local_60.
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_data;
      local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_78.
           super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl
           .super__Vector_impl_data._M_finish + 1;
    }
    pCVar7 = (this->
             super_ChContactTuple<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>).
             objB;
  }
  iVar3 = (*(pCVar7->super_ChContactable)._vptr_ChContactable[4])(pCVar7);
  pCVar4 = this->m_Jac;
  std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::vector
            (&local_38,&local_78);
  ChKblockGeneric::SetVariables(&pCVar4->m_KRM,&local_38);
  if (local_38.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  lVar5 = (long)(iVar3 + iVar2);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&(this->m_Jac->m_K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,
             lVar5,lVar5);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&(this->m_Jac->m_R).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,
             lVar5,lVar5);
  ChKblockGeneric::Get_K(&local_60,&this->m_Jac->m_KRM);
  if (local_60.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value == lVar5) {
    if (local_78.super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.
                      super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  __assert_fail("m_Jac->m_KRM.Get_K().cols() == ndof_w",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChContactSMC.h"
                ,0x233,
                "void chrono::ChContactSMC<chrono::ChContactable_1vars<3>, chrono::ChContactable_1vars<3>>::CreateJacobians() [Ta = chrono::ChContactable_1vars<3>, Tb = chrono::ChContactable_1vars<3>]"
               );
}

Assistant:

void CreateJacobians() {
        delete m_Jac;
        m_Jac = new ChContactJacobian;

        // Set variables and resize Jacobian matrices.
        // NOTE: currently, only contactable objects derived from ChContactable_1vars<6>,
        //       ChContactable_1vars<3>, and ChContactable_3vars<3,3,3> are supported.
        int ndof_w = 0;
        std::vector<ChVariables*> vars;

        vars.push_back(this->objA->GetVariables1());
        if (auto objA_333 = dynamic_cast<ChContactable_3vars<3, 3, 3>*>(this->objA)) {
            vars.push_back(objA_333->GetVariables2());
            vars.push_back(objA_333->GetVariables3());
        }
        ndof_w += this->objA->ContactableGet_ndof_w();

        vars.push_back(this->objB->GetVariables1());
        if (auto objB_333 = dynamic_cast<ChContactable_3vars<3, 3, 3>*>(this->objB)) {
            vars.push_back(objB_333->GetVariables2());
            vars.push_back(objB_333->GetVariables3());
        }
        ndof_w += this->objB->ContactableGet_ndof_w();

        m_Jac->m_KRM.SetVariables(vars);
        m_Jac->m_K.setZero(ndof_w, ndof_w);
        m_Jac->m_R.setZero(ndof_w, ndof_w);
        assert(m_Jac->m_KRM.Get_K().cols() == ndof_w);
    }